

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkResizeVec(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff,
                sunindextype liw_diff,N_Vector tmpl,N_Vector *v)

{
  int iVar1;
  N_Vector p_Var2;
  char *msgfmt;
  
  if (*v == (N_Vector)0x0) {
    return 1;
  }
  if (resize == (ARKVecResizeFn)0x0) {
    N_VDestroy();
    *v = (N_Vector)0x0;
    p_Var2 = (N_Vector)N_VClone(tmpl);
    *v = p_Var2;
    if (p_Var2 != (N_Vector)0x0) goto LAB_00151932;
    msgfmt = "Unable to clone vector";
    iVar1 = 0xcd2;
  }
  else {
    iVar1 = (*resize)(*v,tmpl,resize_data);
    if (iVar1 == 0) {
LAB_00151932:
      ark_mem->lrw = ark_mem->lrw + lrw_diff;
      ark_mem->liw = ark_mem->liw + liw_diff;
      return 1;
    }
    msgfmt = "Error in user-supplied resize() function.";
    iVar1 = 0xcdb;
  }
  arkProcessError(ark_mem,-0x14,iVar1,"arkResizeVec",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return 0;
}

Assistant:

sunbooleantype arkResizeVec(ARKodeMem ark_mem, ARKVecResizeFn resize,
                            void* resize_data, sunindextype lrw_diff,
                            sunindextype liw_diff, N_Vector tmpl, N_Vector* v)
{
  if (*v != NULL)
  {
    if (resize == NULL)
    {
      N_VDestroy(*v);
      *v = NULL;
      *v = N_VClone(tmpl);
      if (*v == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "Unable to clone vector");
        return (SUNFALSE);
      }
    }
    else
    {
      if (resize(*v, tmpl, resize_data))
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RESIZE_FAIL);
        return (SUNFALSE);
      }
    }
    ark_mem->lrw += lrw_diff;
    ark_mem->liw += liw_diff;
  }
  return (SUNTRUE);
}